

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  Printer *in_RDX;
  byte in_SIL;
  FieldDescriptor *in_RDI;
  FieldDescriptor *value;
  FieldDescriptor *key;
  Descriptor *map_entry;
  OneofDescriptor *oneof;
  FieldDescriptor *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  undefined1 cap_first_letter;
  Printer *in_stack_fffffffffffffa88;
  Printer *in_stack_fffffffffffffaa8;
  Printer *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  Printer *in_stack_fffffffffffffac0;
  Printer *in_stack_fffffffffffffac8;
  Printer *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffae0;
  undefined1 is_descriptor_00;
  Printer *in_stack_fffffffffffffae8;
  char (*in_stack_fffffffffffffaf0) [5];
  char *in_stack_fffffffffffffaf8;
  Printer *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb30;
  int is_descriptor_01;
  FieldDescriptor *in_stack_fffffffffffffb38;
  Printer *in_stack_fffffffffffffb40;
  allocator *paVar6;
  allocator *in_stack_fffffffffffffb78;
  Printer *in_stack_fffffffffffffb80;
  string local_420 [28];
  int32 in_stack_fffffffffffffbfc;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [39];
  undefined1 local_399 [33];
  string local_378 [32];
  char *local_358;
  undefined1 local_350 [64];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  FieldDescriptor *local_110;
  allocator local_101;
  string local_100 [32];
  Printer *local_e0;
  Descriptor *local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  OneofDescriptor *local_20;
  undefined8 local_18;
  byte local_9;
  FieldDescriptor *local_8;
  
  cap_first_letter = (undefined1)((ulong)in_stack_fffffffffffffa80 >> 0x38);
  is_descriptor_00 = (undefined1)((ulong)in_stack_fffffffffffffae0 >> 0x38);
  local_9 = in_SIL & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = FieldDescriptor::containing_oneof(in_RDI);
  is_descriptor_01 = (int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  if (local_20 == (OneofDescriptor *)0x0) {
    GenerateFieldDocComment
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,is_descriptor_01,
               (int)in_stack_fffffffffffffb30);
    FieldDescriptor::name_abi_cxx11_(local_8);
    UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
    FieldDescriptor::name_abi_cxx11_(local_8);
    io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
              (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->variable_delimiter_,
               &in_stack_fffffffffffffac0->variable_delimiter_,in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_90);
  }
  else {
    GenerateFieldDocComment
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,is_descriptor_01,
               (int)in_stack_fffffffffffffb30);
    FieldDescriptor::name_abi_cxx11_(local_8);
    UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
    FieldDescriptor::number(local_8);
    IntToString_abi_cxx11_(in_stack_fffffffffffffbfc);
    io::Printer::Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->variable_delimiter_,
               &in_stack_fffffffffffffac0->variable_delimiter_,in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffffa60);
  if ((((!bVar1) && (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4a54ef), !bVar1)) &&
      (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a5504), CVar2 == CPPTYPE_MESSAGE)) &&
     (bVar1 = IsWrapperType(in_stack_fffffffffffffa60), bVar1)) {
    GenerateWrapperFieldGetterDocComment
              (in_stack_fffffffffffffb80,(FieldDescriptor *)in_stack_fffffffffffffb78);
    FieldDescriptor::name_abi_cxx11_(local_8);
    UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
    io::Printer::Print<char[11],std::__cxx11::string>
              (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_b0);
  }
  GenerateFieldDocComment
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             (int)((ulong)in_stack_fffffffffffffb30 >> 0x20),(int)in_stack_fffffffffffffb30);
  FieldDescriptor::name_abi_cxx11_(local_8);
  UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
  io::Printer::Print<char[11],std::__cxx11::string>
            (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
             &in_stack_fffffffffffffab0->variable_delimiter_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(local_d0);
  Indent((Printer *)0x4a5673);
  bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffffa60);
  if (bVar1) {
    local_d8 = FieldDescriptor::message_type(in_stack_fffffffffffffa60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"key",&local_101);
    in_stack_fffffffffffffb80 =
         (Printer *)
         Descriptor::FindFieldByName
                   ((Descriptor *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    in_stack_fffffffffffffb78 = &local_131;
    local_e0 = in_stack_fffffffffffffb80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"value",in_stack_fffffffffffffb78);
    pFVar4 = Descriptor::FindFieldByName
                       ((Descriptor *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_110 = pFVar4;
    pcVar5 = FieldDescriptor::type_name((FieldDescriptor *)0x4a57d3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,pcVar5,&local_179);
    ToUpper(in_stack_fffffffffffffa78);
    pcVar5 = FieldDescriptor::type_name((FieldDescriptor *)0x4a5833);
    paVar6 = &local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,pcVar5,paVar6);
    ToUpper(in_stack_fffffffffffffa78);
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->variable_delimiter_,
               &in_stack_fffffffffffffac0->variable_delimiter_,in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a5917);
    if (CVar2 == CPPTYPE_MESSAGE) {
      FieldDescriptor::message_type(in_stack_fffffffffffffa60);
      FullClassName<google::protobuf::Descriptor>
                ((Descriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
      std::operator+(in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
      io::Printer::Print<char[11],std::__cxx11::string>
                (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                 &in_stack_fffffffffffffab0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string(local_208);
    }
    else {
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a5bab);
      if (CVar2 == CPPTYPE_ENUM) {
        FieldDescriptor::enum_type(in_stack_fffffffffffffa60);
        FullClassName<google::protobuf::EnumDescriptor>
                  ((EnumDescriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
        std::operator+(in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                   &in_stack_fffffffffffffab0->variable_delimiter_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_248);
      }
      else {
        io::Printer::Print<>
                  (in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->variable_delimiter_);
      }
    }
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4a5cc4);
    if (bVar1) {
      pcVar5 = FieldDescriptor::type_name((FieldDescriptor *)0x4a5cea);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,pcVar5,&local_289);
      ToUpper(in_stack_fffffffffffffa78);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                 &in_stack_fffffffffffffab0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a5d96);
      if (CVar2 == CPPTYPE_MESSAGE) {
        FieldDescriptor::message_type(in_stack_fffffffffffffa60);
        FullClassName<google::protobuf::Descriptor>
                  ((Descriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
        std::operator+(in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                   &in_stack_fffffffffffffab0->variable_delimiter_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8);
        std::__cxx11::string::~string(local_2b0);
        std::__cxx11::string::~string(local_2d0);
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a5f03);
        if (CVar2 == CPPTYPE_ENUM) {
          in_stack_fffffffffffffae8 = local_18;
          FieldDescriptor::enum_type(in_stack_fffffffffffffa60);
          FullClassName<google::protobuf::EnumDescriptor>
                    ((EnumDescriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
          std::operator+(in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                     &in_stack_fffffffffffffab0->variable_delimiter_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa8);
          std::__cxx11::string::~string(local_2f0);
          std::__cxx11::string::~string(local_310);
        }
        else {
          io::Printer::Print<>
                    (in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->variable_delimiter_);
        }
      }
    }
    else {
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a601c);
      if (CVar2 == CPPTYPE_MESSAGE) {
        FieldDescriptor::message_type(in_stack_fffffffffffffa60);
        is_descriptor_00 = (undefined1)((ulong)(local_350 + 0x20) >> 0x38);
        LegacyFullClassName<google::protobuf::Descriptor>
                  ((Descriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                   &in_stack_fffffffffffffab0->variable_delimiter_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8);
        std::__cxx11::string::~string((string *)(local_350 + 0x20));
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a60cf);
        if (CVar2 == CPPTYPE_ENUM) {
          in_stack_fffffffffffffac8 = local_18;
          FieldDescriptor::enum_type(in_stack_fffffffffffffa60);
          in_stack_fffffffffffffad0 = (Printer *)local_350;
          LegacyFullClassName<google::protobuf::EnumDescriptor>
                    ((EnumDescriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                     &in_stack_fffffffffffffab0->variable_delimiter_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa8);
          std::__cxx11::string::~string((string *)local_350);
        }
        else {
          CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a6176);
          if (CVar2 == CPPTYPE_STRING) {
            in_stack_fffffffffffffac0 = local_18;
            TVar3 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffa70);
            local_358 = "False";
            if (TVar3 == TYPE_STRING) {
              local_358 = "True";
            }
            io::Printer::Print<char[5],char_const*>
                      (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0
                       ,(char **)in_stack_fffffffffffffae8);
          }
          else {
            in_stack_fffffffffffffaa8 = local_18;
            in_stack_fffffffffffffab0 =
                 (Printer *)FieldDescriptor::cpp_type_name((FieldDescriptor *)0x4a61f3);
            in_stack_fffffffffffffab8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_399;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_399 + 1),&in_stack_fffffffffffffab0->variable_delimiter_,
                       (allocator *)in_stack_fffffffffffffab8);
            UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
            io::Printer::Print<char[5],std::__cxx11::string>
                      (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                       &in_stack_fffffffffffffab0->variable_delimiter_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffaa8);
            std::__cxx11::string::~string(local_378);
            std::__cxx11::string::~string((string *)(local_399 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_399);
          }
        }
      }
    }
  }
  if (local_20 == (OneofDescriptor *)0x0) {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4a639f);
    if (bVar1) {
      FieldDescriptor::name_abi_cxx11_(local_8);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                 &in_stack_fffffffffffffab0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8);
    }
    else {
      in_stack_fffffffffffffa88 = local_18;
      FieldDescriptor::name_abi_cxx11_(local_8);
      io::Printer::Print<char[5],std::__cxx11::string>
                (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                 &in_stack_fffffffffffffab0->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaa8);
    }
  }
  else {
    FieldDescriptor::number(local_8);
    IntToString_abi_cxx11_(in_stack_fffffffffffffbfc);
    io::Printer::Print<char[7],std::__cxx11::string>
              (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_3c0);
  }
  if ((local_9 & 1) != 0) {
    cap_first_letter = local_18._7_1_;
    FieldDescriptor::name_abi_cxx11_(local_8);
    io::Printer::Print<char[11],std::__cxx11::string>
              (in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
  }
  io::Printer::Print<>(in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->variable_delimiter_);
  Outdent((Printer *)0x4a6473);
  io::Printer::Print<>(in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->variable_delimiter_);
  bVar1 = FieldDescriptor::is_map(in_stack_fffffffffffffa60);
  if (((!bVar1) && (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4a64a9), !bVar1)) &&
     ((CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4a64be), CVar2 == CPPTYPE_MESSAGE &&
      (bVar1 = IsWrapperType(in_stack_fffffffffffffa60), bVar1)))) {
    GenerateWrapperFieldSetterDocComment
              (in_stack_fffffffffffffb80,(FieldDescriptor *)in_stack_fffffffffffffb78);
    FieldDescriptor::name_abi_cxx11_(local_8);
    UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
    FieldDescriptor::message_type(in_stack_fffffffffffffa60);
    LegacyFullClassName<google::protobuf::Descriptor>
              ((Descriptor *)in_stack_fffffffffffffae8,(bool)is_descriptor_00);
    io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
              (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->variable_delimiter_,
               &in_stack_fffffffffffffac0->variable_delimiter_,in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_3e0);
  }
  if ((local_9 & 1) != 0) {
    FieldDescriptor::name_abi_cxx11_(local_8);
    UnderscoresToCamelCase((string *)in_stack_fffffffffffffa88,(bool)cap_first_letter);
    FieldDescriptor::name_abi_cxx11_(local_8);
    io::Printer::Print<char[11],std::__cxx11::string,char[11],std::__cxx11::string>
              (in_stack_fffffffffffffad0,&in_stack_fffffffffffffac8->variable_delimiter_,
               &in_stack_fffffffffffffac0->variable_delimiter_,in_stack_fffffffffffffab8,
               &in_stack_fffffffffffffab0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_420);
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    $wrapper = $this->get^camel_name^();\n"
        "    return is_null($wrapper) ? null : $wrapper->getValue();\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, is_descriptor, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^(['value' => $var]);\n"
        "    return $this->set^camel_name^($wrappedVar);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "wrapper_type", LegacyFullClassName(field->message_type(), is_descriptor));
  }

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}